

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_button_symbol
               (nk_command_buffer *out,nk_rect *bounds,nk_rect *content,nk_flags state,
               nk_style_button *style,nk_symbol_type type,nk_user_font *font)

{
  nk_style_item *pnVar1;
  nk_color *pnVar2;
  long lVar3;
  
  pnVar1 = nk_draw_button(out,bounds,state,style);
  pnVar2 = &style->text_background;
  if (pnVar1->type == NK_STYLE_ITEM_COLOR) {
    pnVar2 = (nk_color *)&pnVar1->data;
  }
  lVar3 = 0x6c;
  if ((state & 0x10) == 0) {
    lVar3 = (ulong)((state & 0x20) >> 2) + 0x68;
  }
  nk_draw_symbol(out,type,*content,*pnVar2,*(nk_color *)((long)&(style->normal).type + lVar3),1.0,
                 font);
  return;
}

Assistant:

NK_LIB void
nk_draw_button_symbol(struct nk_command_buffer *out,
    const struct nk_rect *bounds, const struct nk_rect *content,
    nk_flags state, const struct nk_style_button *style,
    enum nk_symbol_type type, const struct nk_user_font *font)
{
    struct nk_color sym, bg;
    const struct nk_style_item *background;

    /* select correct colors/images */
    background = nk_draw_button(out, bounds, state, style);
    if (background->type == NK_STYLE_ITEM_COLOR)
        bg = background->data.color;
    else bg = style->text_background;

    if (state & NK_WIDGET_STATE_HOVER)
        sym = style->text_hover;
    else if (state & NK_WIDGET_STATE_ACTIVED)
        sym = style->text_active;
    else sym = style->text_normal;
    nk_draw_symbol(out, type, *content, bg, sym, 1, font);
}